

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

TCGv_i32 gen_lea_indexed(CPUM68KState_conflict *env,DisasContext_conflict2 *s,TCGv_i32 base)

{
  target_ulong_conflict tVar1;
  uint uVar2;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t uVar3;
  TCGv_i32 tmp;
  TCGv_i32 pTVar4;
  TCGv_i32 pTVar5;
  TCGv_i32 pTVar6;
  uint32_t uVar7;
  ushort uVar8;
  char cVar9;
  
  tcg_ctx = s->uc->tcg_ctx;
  tVar1 = s->pc;
  uVar3 = read_im16(env,s);
  uVar2 = s->env->features;
  if (((uVar3 >> 0xb & 1) == 0) && ((uVar2 & 0x8000) == 0)) {
LAB_0067ed14:
    tmp = tcg_ctx->NULL_QREG;
  }
  else {
    uVar8 = 63999;
    if ((uVar2 >> 0x10 & 1) != 0) {
      uVar8 = 0xffff;
    }
    uVar8 = uVar3 & uVar8;
    if ((uVar2 & 1) == 0) {
      uVar8 = uVar3;
    }
    cVar9 = (char)uVar8;
    if ((uVar8 >> 8 & 1) == 0) {
      tmp = tcg_temp_new_i32(tcg_ctx);
      mark_to_release(s,tmp);
      pTVar4 = gen_addr_index(s,uVar8,tmp);
      if (tcg_ctx->NULL_QREG == base) {
        uVar7 = (int)cVar9 + tVar1;
      }
      else {
        tcg_gen_add_i32(tcg_ctx,tmp,pTVar4,base);
        if (cVar9 == '\0') {
          return tmp;
        }
        uVar7 = (uint32_t)cVar9;
        pTVar4 = tmp;
      }
    }
    else {
      if ((uVar2 >> 0xe & 1) == 0) goto LAB_0067ed14;
      uVar7 = 0;
      if (0x10 < (uVar8 & 0x30)) {
        if ((uVar8 & 0x30) == 0x20) {
          uVar3 = read_im16(env,s);
          uVar7 = (uint32_t)(short)uVar3;
        }
        else {
          uVar7 = read_im32(env,s);
        }
      }
      tmp = tcg_temp_new_i32(tcg_ctx);
      mark_to_release(s,tmp);
      if ((uVar8 & 0x44) == 0) {
        pTVar4 = gen_addr_index(s,uVar8,tmp);
      }
      else {
        pTVar4 = tcg_ctx->NULL_QREG;
      }
      pTVar5 = pTVar4;
      if (-1 < cVar9) {
        pTVar6 = tcg_ctx->NULL_QREG;
        pTVar5 = base;
        if (pTVar6 == base) {
          pTVar5 = tcg_const_i32_m68k(tcg_ctx,uVar7 + tVar1);
          mark_to_release(s,pTVar5);
          pTVar6 = tcg_ctx->NULL_QREG;
          uVar7 = 0;
        }
        if (pTVar4 != pTVar6) {
          tcg_gen_add_i32(tcg_ctx,tmp,pTVar4,pTVar5);
          pTVar5 = tmp;
        }
      }
      if (pTVar5 == tcg_ctx->NULL_QREG) {
        pTVar5 = tcg_const_i32_m68k(tcg_ctx,uVar7);
        mark_to_release(s,pTVar5);
      }
      else if (uVar7 != 0) {
        tcg_gen_addi_i32_m68k(tcg_ctx,tmp,pTVar5,uVar7);
        pTVar5 = tmp;
      }
      if ((uVar8 & 3) == 0) {
        return pTVar5;
      }
      pTVar4 = gen_load(s,2,pTVar5,0,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
      mark_to_release(s,pTVar4);
      if ((uVar8 & 0x44) == 4) {
        pTVar5 = gen_addr_index(s,uVar8,tmp);
        tcg_gen_add_i32(tcg_ctx,tmp,pTVar5,pTVar4);
        pTVar4 = tmp;
      }
      if ((uVar8 & 3) == 1) {
        return pTVar4;
      }
      if ((uVar8 & 3) == 2) {
        uVar3 = read_im16(env,s);
        uVar7 = (uint32_t)(short)uVar3;
      }
      else {
        uVar7 = read_im32(env,s);
      }
      if (uVar7 == 0) {
        return pTVar4;
      }
    }
    tcg_gen_addi_i32_m68k(tcg_ctx,tmp,pTVar4,uVar7);
  }
  return tmp;
}

Assistant:

static TCGv gen_lea_indexed(CPUM68KState *env, DisasContext *s, TCGv base)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t offset;
    uint16_t ext;
    TCGv add;
    TCGv tmp;
    uint32_t bd, od;

    offset = s->pc;
    ext = read_im16(env, s);

    if ((ext & 0x800) == 0 && !m68k_feature(s->env, M68K_FEATURE_WORD_INDEX))
        return tcg_ctx->NULL_QREG;

    if (m68k_feature(s->env, M68K_FEATURE_M68000) &&
        !m68k_feature(s->env, M68K_FEATURE_SCALED_INDEX)) {
        ext &= ~(3 << 9);
    }

    if (ext & 0x100) {
        /* full extension word format */
        if (!m68k_feature(s->env, M68K_FEATURE_EXT_FULL))
            return tcg_ctx->NULL_QREG;

        if ((ext & 0x30) > 0x10) {
            /* base displacement */
            if ((ext & 0x30) == 0x20) {
                bd = (int16_t)read_im16(env, s);
            } else {
                bd = read_im32(env, s);
            }
        } else {
            bd = 0;
        }
        tmp = mark_to_release(s, tcg_temp_new(tcg_ctx));
        if ((ext & 0x44) == 0) {
            /* pre-index */
            add = gen_addr_index(s, ext, tmp);
        } else {
            add = tcg_ctx->NULL_QREG;
        }
        if ((ext & 0x80) == 0) {
            /* base not suppressed */
            if (IS_NULL_QREG(base)) {
                base = mark_to_release(s, tcg_const_i32(tcg_ctx, offset + bd));
                bd = 0;
            }
            if (!IS_NULL_QREG(add)) {
                tcg_gen_add_i32(tcg_ctx, tmp, add, base);
                add = tmp;
            } else {
                add = base;
            }
        }
        if (!IS_NULL_QREG(add)) {
            if (bd != 0) {
                tcg_gen_addi_i32(tcg_ctx, tmp, add, bd);
                add = tmp;
            }
        } else {
            add = mark_to_release(s, tcg_const_i32(tcg_ctx, bd));
        }
        if ((ext & 3) != 0) {
            /* memory indirect */
            base = mark_to_release(s, gen_load(s, OS_LONG, add, 0, IS_USER(s)));
            if ((ext & 0x44) == 4) {
                add = gen_addr_index(s, ext, tmp);
                tcg_gen_add_i32(tcg_ctx, tmp, add, base);
                add = tmp;
            } else {
                add = base;
            }
            if ((ext & 3) > 1) {
                /* outer displacement */
                if ((ext & 3) == 2) {
                    od = (int16_t)read_im16(env, s);
                } else {
                    od = read_im32(env, s);
                }
            } else {
                od = 0;
            }
            if (od != 0) {
                tcg_gen_addi_i32(tcg_ctx, tmp, add, od);
                add = tmp;
            }
        }
    } else {
        /* brief extension word format */
        tmp = mark_to_release(s, tcg_temp_new(tcg_ctx));
        add = gen_addr_index(s, ext, tmp);
        if (!IS_NULL_QREG(base)) {
            tcg_gen_add_i32(tcg_ctx, tmp, add, base);
            if ((int8_t)ext)
                tcg_gen_addi_i32(tcg_ctx, tmp, tmp, (int8_t)ext);
        } else {
            tcg_gen_addi_i32(tcg_ctx, tmp, add, offset + (int8_t)ext);
        }
        add = tmp;
    }
    return add;
}